

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O0

void icu_63::millisToOffset(int32_t millis,UnicodeString *str)

{
  int iVar1;
  int number;
  int32_t t;
  int32_t sec;
  int32_t min;
  int32_t hour;
  UnicodeString *str_local;
  int32_t millis_local;
  
  UnicodeString::remove(str,(char *)str);
  if (millis < 0) {
    UnicodeString::append(str,L'-');
    str_local._4_4_ = -millis;
  }
  else {
    UnicodeString::append(str,L'+');
    str_local._4_4_ = millis;
  }
  number = (str_local._4_4_ / 1000) % 0x3c;
  iVar1 = (str_local._4_4_ / 1000 - number) / 0x3c;
  appendAsciiDigits(iVar1 / 0x3c,'\x02',str);
  appendAsciiDigits(iVar1 % 0x3c,'\x02',str);
  appendAsciiDigits(number,'\x02',str);
  return;
}

Assistant:

static void millisToOffset(int32_t millis, UnicodeString& str) {
    str.remove();
    if (millis >= 0) {
        str.append(PLUS);
    } else {
        str.append(MINUS);
        millis = -millis;
    }
    int32_t hour, min, sec;
    int32_t t = millis / 1000;

    sec = t % 60;
    t = (t - sec) / 60;
    min = t % 60;
    hour = t / 60;

    appendAsciiDigits(hour, 2, str);
    appendAsciiDigits(min, 2, str);
    appendAsciiDigits(sec, 2, str);
}